

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# security_materials.cpp
# Opt level: O1

Error * ot::commissioner::security_material::GetNetworkSM
                  (Error *__return_storage_ptr__,string *aAlias,bool aNeedCert,bool aNeedPSKc,
                  SecurityMaterials *aSM)

{
  ErrorCode EVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [8];
  _Alloc_hider _Var5;
  char *pcVar6;
  char *pcVar7;
  undefined7 in_register_00000009;
  long lVar8;
  char *pcVar9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  pointer __rhs;
  bool bVar10;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>
  __l;
  string out;
  string path;
  Error tokenError;
  string nwkPath;
  writer write_1;
  writer write;
  ByteArray bytes;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
  smElements;
  undefined1 local_218 [24];
  char local_200 [16];
  string *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined1 local_1c8 [8];
  _Alloc_hider _Stack_1c0;
  undefined1 local_1b8 [24];
  parse_func local_1a0 [1];
  undefined8 local_198;
  undefined8 local_190;
  undefined1 local_188;
  ByteArray *local_180;
  undefined4 *local_178 [2];
  undefined4 local_168;
  undefined2 local_164;
  undefined1 local_162;
  ByteArray *local_158;
  SecurityMaterials *local_150;
  undefined4 local_144;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  writer local_120;
  undefined1 local_118 [32];
  ByteArray local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  pointer local_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  string local_b0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
  local_90;
  string local_78 [2];
  
  local_144 = (undefined4)CONCAT71(in_register_00000009,aNeedPSKc);
  local_d0[0] = local_c0;
  local_150 = aSM;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"nwk/","");
  __return_storage_ptr__->mCode = kNone;
  local_1f0 = (string *)&__return_storage_ptr__->mMessage;
  local_e0 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_e0;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  local_140._M_string_length = 0;
  local_140.field_2._M_local_buf[0] = '\0';
  local_1c8 = (undefined1  [8])local_1b8;
  std::__cxx11::string::_M_construct<char*>((string *)local_1c8,smRoot,DAT_002973f0 + smRoot);
  _Var5._M_p = _Stack_1c0._M_p;
  if (local_1c8 != (undefined1  [8])local_1b8) {
    operator_delete((void *)local_1c8);
  }
  if (_Var5._M_p != (pointer)0x0) {
    local_1c8 = (undefined1  [8])local_1b8;
    std::__cxx11::string::_M_construct<char*>((string *)local_1c8,smRoot,DAT_002973f0 + smRoot);
    pcVar7 = (char *)std::__cxx11::string::_M_append(local_1c8,(ulong)local_d0[0]);
    pcVar7 = (char *)std::__cxx11::string::_M_append(pcVar7,(ulong)(aAlias->_M_dataplus)._M_p);
    std::__cxx11::string::append(pcVar7);
    std::__cxx11::string::_M_assign((string *)&local_140);
    if (local_1c8 != (undefined1  [8])local_1b8) {
      operator_delete((void *)local_1c8);
    }
    local_78[0]._M_dataplus._M_p = (pointer)&local_78[0].field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,local_140._M_dataplus._M_p,
               local_140._M_dataplus._M_p + local_140._M_string_length);
    PathExists((Error *)local_1c8,local_78);
    __return_storage_ptr__->mCode = local_1c8._0_4_;
    std::__cxx11::string::operator=(local_1f0,(string *)&_Stack_1c0);
    EVar1 = __return_storage_ptr__->mCode;
    if (_Stack_1c0._M_p != local_1b8 + 8) {
      operator_delete(_Stack_1c0._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78[0]._M_dataplus._M_p != &local_78[0].field_2) {
      operator_delete(local_78[0]._M_dataplus._M_p);
    }
    if (EVar1 == kNone) {
      if (aNeedCert) {
        local_1a0[0] = (parse_func)&local_190;
        local_1b8._0_8_ = 0x6d65702e74726563;
        _Stack_1c0._M_p = (pointer)0x8;
        local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffffffffff00;
        local_1b8._16_8_ = &local_150->mCertificate;
        local_190 = 0x6d65702e76697270;
        local_198 = 8;
        local_188 = 0;
        local_180 = &local_150->mPrivateKey;
        local_168 = 0x702e6163;
        local_164 = 0x6d65;
        local_178[1] = (undefined4 *)0x6;
        local_162 = 0;
        local_158 = &local_150->mTrustAnchor;
        __l._M_len = 3;
        __l._M_array = (iterator)local_1c8;
        local_1c8 = (undefined1  [8])local_1b8;
        local_178[0] = &local_168;
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
        ::vector(&local_90,__l,(allocator_type *)local_218);
        lVar8 = 0;
        do {
          if ((void *)((long)&local_168 + lVar8) != *(void **)((long)local_178 + lVar8)) {
            operator_delete(*(void **)((long)local_178 + lVar8));
          }
          lVar8 = lVar8 + -0x28;
        } while (lVar8 != -0x78);
        local_d8 = local_90.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if (local_90.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_90.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          __rhs = local_90.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          do {
            std::operator+(&local_1e8,&local_140,&__rhs->first);
            local_1c8 = (undefined1  [8])((ulong)local_1c8 & 0xffffffff00000000);
            _Stack_1c0._M_p = local_1b8 + 8;
            local_1b8._0_8_ = 0;
            local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffffffffff00;
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b0,local_1e8._M_dataplus._M_p,
                       local_1e8._M_string_length + local_1e8._M_dataplus._M_p);
            PathExists((Error *)local_218,&local_b0);
            uVar3 = local_1c8._0_4_;
            uVar2 = local_218._0_4_;
            if ((char *)local_218._8_8_ != local_200) {
              operator_delete((void *)local_218._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
            if (_Stack_1c0._M_p != local_1b8 + 8) {
              operator_delete(_Stack_1c0._M_p);
            }
            if (uVar3 == uVar2) {
              local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              ReadPemFile((Error *)local_1c8,&local_f8,&local_1e8);
              __return_storage_ptr__->mCode = local_1c8._0_4_;
              std::__cxx11::string::operator=(local_1f0,(string *)&_Stack_1c0);
              if (_Stack_1c0._M_p != local_1b8 + 8) {
                operator_delete(_Stack_1c0._M_p);
              }
              auVar4 = local_1c8;
              local_1c8 = (undefined1  [8])((ulong)local_1c8 & 0xffffffff00000000);
              _Stack_1c0._M_p = local_1b8 + 8;
              local_1b8._0_8_ = 0;
              local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffffffffff00;
              if (__return_storage_ptr__->mCode == kNone) {
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                          (__rhs->second,&local_f8);
              }
              else {
                if (gVerbose == '\x01') {
                  local_1c8._4_4_ = auVar4._4_4_;
                  local_1c8._0_4_ = kAlreadyExists;
                  pcVar7 = "Failed to read security data from file {}";
                  _Stack_1c0._M_p = "Failed to read security data from file {}";
                  local_1b8._0_8_ = 0x29;
                  local_1b8._8_8_ = 0x100000000;
                  local_1b8._16_8_ = local_1c8;
                  local_1a0[0] = ::fmt::v10::detail::
                                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
                  ;
                  local_118._0_8_ = local_1b8._16_8_;
                  do {
                    if (pcVar7 == "") break;
                    pcVar9 = pcVar7;
                    if (*pcVar7 == '{') {
LAB_0015ec4d:
                      ::fmt::v10::detail::
                      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::writer::operator()((writer *)local_118,pcVar7,pcVar9);
                      pcVar7 = ::fmt::v10::detail::
                               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                         (pcVar9,"",(format_string_checker<char> *)local_1c8);
                      bVar10 = true;
                    }
                    else {
                      pcVar9 = pcVar7 + 1;
                      bVar10 = pcVar9 != "";
                      if (bVar10) {
                        if (*pcVar9 != '{') {
                          pcVar6 = pcVar7 + 2;
                          do {
                            pcVar9 = pcVar6;
                            bVar10 = pcVar9 != "";
                            if (pcVar9 == "") goto LAB_0015ec49;
                            pcVar6 = pcVar9 + 1;
                          } while (*pcVar9 != '{');
                        }
                        bVar10 = true;
                      }
LAB_0015ec49:
                      if (bVar10) goto LAB_0015ec4d;
                      ::fmt::v10::detail::
                      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::writer::operator()((writer *)local_118,pcVar7,"");
                      bVar10 = false;
                    }
                  } while (bVar10);
                  local_1c8 = (undefined1  [8])local_1e8._M_dataplus._M_p;
                  _Stack_1c0._M_p = (pointer)local_1e8._M_string_length;
                  fmt.size_ = 0xd;
                  fmt.data_ = (char *)0x29;
                  args.field_1.args_ = in_R9.args_;
                  args.desc_ = (unsigned_long_long)local_1c8;
                  ::fmt::v10::vformat_abi_cxx11_
                            ((string *)local_218,(v10 *)"Failed to read security data from file {}",
                             fmt,args);
                  Console::Write((string *)local_218,kRed);
                }
                else {
                  local_218._0_8_ = local_218 + 0x10;
                  local_1c8 = (undefined1  [8])0x12;
                  local_218._0_8_ =
                       std::__cxx11::string::_M_create((ulong *)local_218,(ulong)local_1c8);
                  local_218._16_8_ = local_1c8;
                  builtin_memcpy((void *)local_218._0_8_,"security-materials",0x12);
                  local_218._8_8_ = local_1c8;
                  *(uchar *)(local_218._0_8_ + (long)local_1c8) = '\0';
                  local_1c8._0_4_ = kAlreadyExists;
                  pcVar7 = "Failed to read security data from file {}";
                  _Stack_1c0._M_p = "Failed to read security data from file {}";
                  local_1b8._0_8_ = 0x29;
                  local_1b8._8_8_ = 0x100000000;
                  local_1a0[0] = ::fmt::v10::detail::
                                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
                  ;
                  local_1b8._16_8_ = (format_string_checker<char> *)local_1c8;
                  local_120.handler_ = (format_string_checker<char> *)local_1c8;
                  do {
                    if (pcVar7 == "") break;
                    pcVar9 = pcVar7;
                    if (*pcVar7 == '{') {
LAB_0015edbb:
                      ::fmt::v10::detail::
                      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::writer::operator()(&local_120,pcVar7,pcVar9);
                      pcVar7 = ::fmt::v10::detail::
                               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                         (pcVar9,"",(format_string_checker<char> *)local_1c8);
                      bVar10 = true;
                    }
                    else {
                      pcVar9 = pcVar7 + 1;
                      bVar10 = pcVar9 != "";
                      if (bVar10) {
                        if (*pcVar9 != '{') {
                          pcVar6 = pcVar7 + 2;
                          do {
                            pcVar9 = pcVar6;
                            bVar10 = pcVar9 != "";
                            if (pcVar9 == "") goto LAB_0015edb7;
                            pcVar6 = pcVar9 + 1;
                          } while (*pcVar9 != '{');
                        }
                        bVar10 = true;
                      }
LAB_0015edb7:
                      if (bVar10) goto LAB_0015edbb;
                      ::fmt::v10::detail::
                      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::writer::operator()(&local_120,pcVar7,"");
                      bVar10 = false;
                    }
                  } while (bVar10);
                  local_1c8 = (undefined1  [8])local_1e8._M_dataplus._M_p;
                  _Stack_1c0._M_p = (pointer)local_1e8._M_string_length;
                  fmt_00.size_ = 0xd;
                  fmt_00.data_ = (char *)0x29;
                  args_00.field_1.args_ = in_R9.args_;
                  args_00.desc_ = (unsigned_long_long)local_1c8;
                  ::fmt::v10::vformat_abi_cxx11_
                            ((string *)local_118,(v10 *)"Failed to read security data from file {}",
                             fmt_00,args_00);
                  Log(kError,(string *)local_218,(string *)local_118);
                  if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
                    operator_delete((void *)local_118._0_8_);
                  }
                }
                if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
                  operator_delete((void *)local_218._0_8_);
                }
              }
              if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_f8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p);
            }
            __rhs = __rhs + 1;
          } while (__rhs != local_d8);
        }
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e8,local_140._M_dataplus._M_p,
                   local_140._M_dataplus._M_p + local_140._M_string_length);
        std::__cxx11::string::append((char *)&local_1e8);
        local_1c8 = (undefined1  [8])((ulong)local_1c8 & 0xffffffff00000000);
        _Stack_1c0._M_p = local_1b8 + 8;
        local_1b8._0_8_ = 0;
        local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffffffffff00;
        local_118._0_8_ = (ByteArray *)(local_118 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_118,local_1e8._M_dataplus._M_p,
                   local_1e8._M_string_length + local_1e8._M_dataplus._M_p);
        PathExists((Error *)local_218,(string *)local_118);
        uVar3 = local_1c8._0_4_;
        uVar2 = local_218._0_4_;
        if ((char *)local_218._8_8_ != local_200) {
          operator_delete((void *)local_218._8_8_);
        }
        if ((ByteArray *)local_118._0_8_ != (ByteArray *)(local_118 + 0x10)) {
          operator_delete((void *)local_118._0_8_);
        }
        if (_Stack_1c0._M_p != local_1b8 + 8) {
          operator_delete(_Stack_1c0._M_p);
        }
        if (uVar3 == uVar2) {
          local_218._0_8_ = (pointer)0x0;
          local_218._8_8_ = (char *)0x0;
          local_218._16_8_ = (pointer)0x0;
          ReadHexStringFile((Error *)local_1c8,(ByteArray *)local_218,&local_1e8);
          if (local_1c8._0_4_ == none_type) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                      (&local_150->mCommissionerToken,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_218);
          }
          if (_Stack_1c0._M_p != local_1b8 + 8) {
            operator_delete(_Stack_1c0._M_p);
          }
          if ((pointer)local_218._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_218._0_8_);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p);
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
        ::~vector(&local_90);
      }
      if ((char)local_144 != '\0') {
        local_218._0_8_ = local_218 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_218,local_140._M_dataplus._M_p,
                   local_140._M_dataplus._M_p + local_140._M_string_length);
        std::__cxx11::string::append(local_218);
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e8,local_218._0_8_,(char *)(local_218._8_8_ + local_218._0_8_))
        ;
        PathExists((Error *)local_1c8,&local_1e8);
        __return_storage_ptr__->mCode = local_1c8._0_4_;
        std::__cxx11::string::operator=(local_1f0,(string *)&_Stack_1c0);
        EVar1 = __return_storage_ptr__->mCode;
        if (_Stack_1c0._M_p != local_1b8 + 8) {
          operator_delete(_Stack_1c0._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p);
        }
        if (EVar1 == kNone) {
          ReadHexStringFile((Error *)local_1c8,&local_150->mPSKc,(string *)local_218);
          __return_storage_ptr__->mCode = local_1c8._0_4_;
          std::__cxx11::string::operator=(local_1f0,(string *)&_Stack_1c0);
          if (_Stack_1c0._M_p != local_1b8 + 8) {
            operator_delete(_Stack_1c0._M_p);
          }
        }
        if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
          operator_delete((void *)local_218._0_8_);
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

Error GetNetworkSM(const std::string &aAlias, bool aNeedCert, bool aNeedPSKc, SecurityMaterials &aSM)
{
    return GetNetworkSMImpl("nwk/", aAlias, aNeedCert, aNeedPSKc, aSM);
}